

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

string * __thiscall
CoreML::keyTypeToString_abi_cxx11_(string *__return_storage_ptr__,CoreML *this,KeyTypeCase tag)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 0) {
    pcVar2 = "Invalid";
    pcVar1 = "";
  }
  else if ((int)this == 2) {
    pcVar2 = "String";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Int64";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string keyTypeToString(Specification::DictionaryFeatureType::KeyTypeCase tag) {
        switch (tag) {
            case Specification::DictionaryFeatureType::kInt64KeyType:
                return "Int64";
            case Specification::DictionaryFeatureType::kStringKeyType:
                return "String";
            case Specification::DictionaryFeatureType::KEYTYPE_NOT_SET:
                return "Invalid";
        }
    }